

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O0

HighsStatus worseStatus(HighsStatus status0,HighsStatus status1)

{
  HighsStatus return_status;
  HighsStatus status1_local;
  HighsStatus status0_local;
  
  if ((status0 == kError) || (status1 == kError)) {
    return_status = kError;
  }
  else if ((status0 == kWarning) || (status1 == kWarning)) {
    return_status = kWarning;
  }
  else {
    return_status = kOk;
  }
  return return_status;
}

Assistant:

HighsStatus worseStatus(const HighsStatus status0, const HighsStatus status1) {
  HighsStatus return_status = HighsStatus::kError;
  if (status0 == HighsStatus::kError || status1 == HighsStatus::kError)
    return_status = HighsStatus::kError;
  else if (status0 == HighsStatus::kWarning || status1 == HighsStatus::kWarning)
    return_status = HighsStatus::kWarning;
  else
    return_status = HighsStatus::kOk;
  return return_status;
}